

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,ExtPubkey *ext_pubkey,string *arg)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this->key_type_ = kDescriptorKeyBip32;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  ExtPubkey::GetPubkey(&this->pubkey_,ext_pubkey);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_,ext_pubkey);
  KeyData::KeyData(&this->key_data_);
  if (arg == (string *)0x0) {
    ::std::__cxx11::string::string((string *)&this->argument_,"",(allocator *)&local_48);
  }
  else {
    ::std::__cxx11::string::string((string *)&this->argument_,(string *)arg);
  }
  SchnorrPubkey::FromPubkey((SchnorrPubkey *)&local_48,&this->pubkey_,(bool *)0x0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             &local_48);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const ExtPubkey& ext_pubkey, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32),
      pubkey_(ext_pubkey.GetPubkey()),
      extpubkey_(ext_pubkey),
      argument_((arg) ? *arg : "") {
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}